

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O0

uint8_t * apx_attributeParser_parse_initializer_list
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end)

{
  uint8_t uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint8_t *puVar4;
  dtl_av_t *pdVar5;
  apx_attributeParseState_t *paVar6;
  bool bVar7;
  uint8_t *result;
  apx_attributeParseState_t *child_state;
  uint8_t *puStack_30;
  uint8_t c;
  uint8_t *next;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_attributeParser_t *self_local;
  
  puStack_30 = begin;
  while (puStack_30 < end) {
    puVar4 = bstr_lstrip(puStack_30,end);
    if (*puVar4 == '{') {
      puStack_30 = puVar4 + 1;
      pdVar5 = dtl_av_new();
      self->state->initializer_list = pdVar5;
      adt_stack_push(&self->stack,self->state);
      paVar6 = apx_attributeParseState_new();
      if (paVar6 == (apx_attributeParseState_t *)0x0) {
        apx_attributeParser_set_error(self,2,puStack_30);
        return (uint8_t *)0x0;
      }
      paVar6->parent = self->state;
      self->state = paVar6;
    }
    else {
      puStack_30 = apx_attributeParser_parse_scalar(self,puVar4,end);
      if ((puStack_30 <= puVar4) &&
         (bVar7 = puStack_30 == (uint8_t *)0x0, puStack_30 = puVar4, bVar7)) {
        return (uint8_t *)0x0;
      }
      while( true ) {
        _Var2 = apx_attributeParser_is_initializer_list(self);
        if (!_Var2) goto LAB_0012755f;
        puStack_30 = bstr_lstrip(puStack_30,end);
        uVar1 = *puStack_30;
        _Var2 = apx_attributeParseState_has_value(self->state);
        if ((_Var2) && (_Var2 = apx_attributeParser_push_value_to_parent(self), !_Var2)) {
          return (uint8_t *)0x0;
        }
        _Var2 = dtl_av_is_empty(self->state->parent->initializer_list);
        if ((!_Var2) && (uVar1 == ',')) break;
        if (uVar1 != '}') {
          return (uint8_t *)0x0;
        }
        puStack_30 = puStack_30 + 1;
        uVar3 = adt_stack_size(&self->stack);
        if (uVar3 == 0) {
          return (uint8_t *)0x0;
        }
        apx_attributeParseState_delete(self->state);
        paVar6 = (apx_attributeParseState_t *)adt_stack_top(&self->stack);
        self->state = paVar6;
        adt_stack_pop(&self->stack);
        uVar3 = adt_stack_size(&self->stack);
        if (uVar3 == 0) goto LAB_0012755f;
      }
      puStack_30 = puStack_30 + 1;
    }
  }
LAB_0012755f:
  puVar4 = bstr_lstrip(puStack_30,end);
  return puVar4;
}

Assistant:

static uint8_t const* apx_attributeParser_parse_initializer_list(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* next = begin;
   while (next < end)
   {
      uint8_t c;
      next = bstr_lstrip(next, end);
      c = *next;

      if (c == '{')
      {
         apx_attributeParseState_t* child_state;
         next++;
         self->state->initializer_list = dtl_av_new();
         adt_stack_push(&self->stack, self->state);
         child_state = apx_attributeParseState_new();
         if (child_state == NULL)
         {
            apx_attributeParser_set_error(self, APX_MEM_ERROR, next);
            return NULL;
         }
         else
         {
            child_state->parent = self->state;
            self->state = child_state;
            continue;
         }
      }
      else
      {
         uint8_t const* result = apx_attributeParser_parse_scalar(self, next, end);
         if (result > next)
         {
            next = result;
         }
         else if (result == NULL)
         {
            return result;
         }
      }
   POST_VALUE_HANDLER:
      if (apx_attributeParser_is_initializer_list(self))
      {
         next = bstr_lstrip(next, end);
         c = *next;
         if (apx_attributeParseState_has_value(self->state))
         {
            if (!apx_attributeParser_push_value_to_parent(self))
            {
               return NULL;
            }
         }
         if (!dtl_av_is_empty(self->state->parent->initializer_list) && (c == ','))
         {
            next++;
         }
         else if (c == '}')
         {
            next++;
            if (adt_stack_size(&self->stack) > 0)
            {
               apx_attributeParseState_delete(self->state);
               self->state = adt_stack_top(&self->stack);
               adt_stack_pop(&self->stack);
               if (adt_stack_size(&self->stack) == 0u )
               {
                  break; //Reached top of stack
               }
               else
               {
                  goto POST_VALUE_HANDLER;
               }
            }
            else
            {
               return NULL;
            }
         }
         else
         {
            //unexpected character
            return NULL;
         }
      }
      else
      {
         break;
      }
   }
   next = bstr_lstrip(next, end);
   return next;
}